

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

void duckdb::GlobFilesInternal
               (FileSystem *fs,string *path,string *glob,bool match_directory,
               vector<duckdb::OpenFileInfo,_true> *result,bool join_path)

{
  bool join_path_local;
  bool match_directory_local;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  join_path_local = join_path;
  match_directory_local = match_directory;
  local_48._M_unused._M_object = operator_new(0x30);
  *(bool **)local_48._M_unused._0_8_ = &match_directory_local;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = glob;
  *(bool **)((long)local_48._M_unused._0_8_ + 0x10) = &join_path_local;
  *(vector<duckdb::OpenFileInfo,_true> **)((long)local_48._M_unused._0_8_ + 0x18) = result;
  *(FileSystem **)((long)local_48._M_unused._0_8_ + 0x20) = fs;
  *(string **)((long)local_48._M_unused._0_8_ + 0x28) = path;
  pcStack_30 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_48,0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

static void GlobFilesInternal(FileSystem &fs, const string &path, const string &glob, bool match_directory,
                              vector<OpenFileInfo> &result, bool join_path) {
	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		if (is_directory != match_directory) {
			return;
		}
		if (Glob(fname.c_str(), fname.size(), glob.c_str(), glob.size())) {
			if (join_path) {
				result.push_back(fs.JoinPath(path, fname));
			} else {
				result.push_back(fname);
			}
		}
	});
}